

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O2

string * __thiscall
t_xsd_generator::xsd(string *__return_storage_ptr__,t_xsd_generator *this,string *in)

{
  allocator local_51;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)in);
  std::__cxx11::string::string((string *)&local_50,"xsd",&local_51);
  ns(__return_storage_ptr__,this,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string xsd(std::string in) { return ns(in, "xsd"); }